

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void envy_bios_print_mem_type(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  char *pcVar2;
  uint length;
  ulong uVar3;
  byte bVar4;
  
  uVar1 = (bios->mem).type.offset;
  if ((mask >> 0xc & 1) == 0 || uVar1 == 0) {
    return;
  }
  bVar4 = -(strap == 0) | (byte)strap >> 2 & 7;
  fprintf((FILE *)out,"MEM TYPE table at 0x%x, version %x, %u entries\n",(ulong)uVar1,
          (ulong)(bios->mem).type.version,(ulong)(bios->mem).type.entriesnum);
  if ((bios->mem).type.version == '\x10') {
    if (strap == 0) {
      pcVar2 = "Missing strap_peek!";
    }
    else {
      pcVar2 = mem_type('\x10',(ushort)(bios->mem).type.rlen * (ushort)bVar4 +
                               (ushort)(bios->mem).type.hlen + (bios->mem).type.offset);
    }
    printf("Detected ram type: %s\n",pcVar2);
  }
  envy_bios_dump_hex(bios,out,(uint)(bios->mem).type.offset,(uint)(bios->mem).type.hlen,mask);
  if ((int)mask < 0) {
    fputc(10,(FILE *)out);
  }
  if ((bios->mem).type.entriesnum != '\0') {
    uVar3 = 0;
    do {
      pcVar2 = "    ";
      if (bVar4 == uVar3) {
        pcVar2 = "   *";
      }
      fwrite(pcVar2,4,1,(FILE *)out);
      fprintf((FILE *)out,"%02u: Ram type: %s\n",uVar3 & 0xffffffff,(bios->mem).type.entries[uVar3])
      ;
      length = (uint)(bios->mem).type.rlen;
      envy_bios_dump_hex(bios,out,(int)uVar3 * length +
                                  (uint)(bios->mem).type.hlen + (uint)(bios->mem).type.offset,length
                         ,mask);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (bios->mem).type.entriesnum);
  }
  fputc(10,(FILE *)out);
  return;
}

Assistant:

void
envy_bios_print_mem_type(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_type *mt = &bios->mem.type;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;
	int i;

	if (!mt->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TYPE table at 0x%x, version %x, %u entries\n", mt->offset, mt->version, mt->entriesnum);
	if(mt->version == 0x10) {
		printf("Detected ram type: %s\n",
		       strap ? mem_type(mt->version, mt->offset + mt->hlen + (ram_cfg*mt->rlen)) : "Missing strap_peek!");
	}

	envy_bios_dump_hex(bios, out, mt->offset, mt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < mt->entriesnum; i++) {
		if(i == ram_cfg) {
			fprintf(out, "   *");
		} else {
			fprintf(out,"    ");
		}
		fprintf(out,"%02u: Ram type: %s\n", i, mt->entries[i]);
		envy_bios_dump_hex(bios, out, mt->offset + mt->hlen + (mt->rlen * i), mt->rlen, mask);
	}

	fprintf(out, "\n");
}